

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::BeginMainMenuBar(void)

{
  float _x;
  bool bVar1;
  float _y;
  bool is_open;
  ImGuiWindowFlags window_flags;
  ImGuiContext *g;
  ImGuiWindowFlags in_stack_00000654;
  bool *in_stack_00000658;
  char *in_stack_00000660;
  bool local_49;
  ImVec2 local_48;
  bool local_3d;
  int count;
  ImVec2 local_38;
  float in_stack_ffffffffffffffd0;
  float in_stack_ffffffffffffffd4;
  ImVec2 in_stack_ffffffffffffffd8;
  float in_stack_ffffffffffffffe4;
  ImVec2 local_18;
  ImGuiContext *local_10;
  
  local_10 = GImGui;
  _x = (GImGui->Style).DisplaySafeAreaPadding.x;
  _y = ImMax<float>((GImGui->Style).DisplaySafeAreaPadding.y - (GImGui->Style).FramePadding.y,0.0);
  ImVec2::ImVec2(&local_18,_x,_y);
  (local_10->NextWindowData).MenuBarOffsetMinVal = local_18;
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffe0,0.0,0.0);
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffd8,0.0,0.0);
  SetNextWindowPos((ImVec2 *)&stack0xffffffffffffffe0,0,(ImVec2 *)&stack0xffffffffffffffd8);
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffd0,(local_10->IO).DisplaySize.x,
                 (local_10->NextWindowData).MenuBarOffsetMinVal.y + local_10->FontBaseSize +
                 (local_10->Style).FramePadding.y);
  SetNextWindowSize((ImVec2 *)&stack0xffffffffffffffd0,0);
  PushStyleVar((ImGuiStyleVar)in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
  ImVec2::ImVec2(&local_38,0.0,0.0);
  PushStyleVar((ImGuiStyleVar)in_stack_ffffffffffffffe4,(ImVec2 *)in_stack_ffffffffffffffd8);
  count = 0x50f;
  bVar1 = Begin(in_stack_00000660,in_stack_00000658,in_stack_00000654);
  local_49 = false;
  if (bVar1) {
    local_49 = BeginMenuBar();
  }
  local_3d = local_49;
  PopStyleVar(count);
  ImVec2::ImVec2(&local_48,0.0,0.0);
  (local_10->NextWindowData).MenuBarOffsetMinVal = local_48;
  bVar1 = (local_3d & 1U) != 0;
  if (!bVar1) {
    End();
  }
  return bVar1;
}

Assistant:

bool ImGui::BeginMainMenuBar()
{
    ImGuiContext& g = *GImGui;
    g.NextWindowData.MenuBarOffsetMinVal = ImVec2(g.Style.DisplaySafeAreaPadding.x, ImMax(g.Style.DisplaySafeAreaPadding.y - g.Style.FramePadding.y, 0.0f));
    SetNextWindowPos(ImVec2(0.0f, 0.0f));
    SetNextWindowSize(ImVec2(g.IO.DisplaySize.x, g.NextWindowData.MenuBarOffsetMinVal.y + g.FontBaseSize + g.Style.FramePadding.y));
    PushStyleVar(ImGuiStyleVar_WindowRounding, 0.0f);
    PushStyleVar(ImGuiStyleVar_WindowMinSize, ImVec2(0,0));
    ImGuiWindowFlags window_flags = ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoMove | ImGuiWindowFlags_NoScrollbar | ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_MenuBar;
    bool is_open = Begin("##MainMenuBar", NULL, window_flags) && BeginMenuBar();
    PopStyleVar(2);
    g.NextWindowData.MenuBarOffsetMinVal = ImVec2(0.0f, 0.0f);
    if (!is_open)
    {
        End();
        return false;
    }
    return true;
}